

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::noOverlapMerge
          (AlignmentRecord *this,string *algn,string *ref,string *dna,string *qualities,
          string *nucigar,int *c_pos,int *q_pos,int *ref_pos,int *ref_rel_pos,int i)

{
  char cVar1;
  ShortDnaSequence *this_00;
  char cVar4;
  string r;
  allocator local_50 [32];
  char cVar2;
  char cVar3;
  
  std::__cxx11::string::string((string *)&r,"",local_50);
  if (i == 1) {
    cVar4 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos];
    std::__cxx11::string::string((string *)local_50,(string *)&this->reference_seq1);
    this_00 = &this->sequence1;
  }
  else {
    cVar4 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos];
    std::__cxx11::string::string((string *)local_50,(string *)&this->reference_seq2);
    this_00 = &this->sequence2;
  }
  std::__cxx11::string::operator=((string *)&r,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  cVar1 = (char)algn;
  cVar2 = (char)ref;
  cVar3 = (char)nucigar;
  switch(cVar4) {
  case 'D':
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::at((ulong)&r);
    std::__cxx11::string::push_back(cVar2);
    *ref_rel_pos = *ref_rel_pos + 1;
    std::__cxx11::string::push_back(cVar3);
    q_pos = ref_pos;
    break;
  case 'E':
  case 'F':
  case 'G':
  case 'J':
  case 'K':
  case 'L':
    goto switchD_0018e840_caseD_45;
  case 'H':
    q_pos = ref_pos;
    ref_pos = ref_rel_pos;
    goto LAB_0018e972;
  case 'I':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back(cVar1);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar3);
    break;
  case 'M':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back(cVar1);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::at((ulong)&r);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar3);
    goto LAB_0018e95d;
  default:
    if (cVar4 != 'S') goto switchD_0018e840_caseD_45;
LAB_0018e95d:
    *ref_rel_pos = *ref_rel_pos + 1;
LAB_0018e972:
    *ref_pos = *ref_pos + 1;
  }
  *q_pos = *q_pos + 1;
  *c_pos = *c_pos + 1;
switchD_0018e840_caseD_45:
  std::__cxx11::string::~string((string *)&r);
  return;
}

Assistant:

void AlignmentRecord::noOverlapMerge(std::string& algn,std::string& ref,std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos, int& q_pos, int& ref_pos, int& ref_rel_pos, int i) const{
    char c;
    const ShortDnaSequence* s = 0;
    std::string r = "";
    if (i == 1){
        c = this->cigar1_unrolled[c_pos];
        s = &this->sequence1;
        r = this->getReferenceSeq1();
    } else {
        c = this->cigar2_unrolled[c_pos];
        s = &this->sequence2;
        r = this->getReferenceSeq2();
    }
    if (c == 'H'){
        ref_rel_pos++;
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= 'I';
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        algn += 'D';
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= r.at(ref_rel_pos);

        nucigar += c;
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);

    }
}